

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjectFile.cpp
# Opt level: O1

bool __thiscall ObjectFile::deleteAttribute(ObjectFile *this,CK_ATTRIBUTE_TYPE type)

{
  map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  *this_00;
  mapped_type pOVar1;
  mapped_type *ppOVar2;
  undefined1 uVar3;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>,_std::_Rb_tree_iterator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
  pVar4;
  MutexLocker lock;
  CK_ATTRIBUTE_TYPE local_30;
  MutexLocker local_28;
  
  local_30 = type;
  if (this->valid == false) {
    uVar3 = 0;
    softHSMLog(7,"deleteAttribute",
               "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
               ,0xf1,"Cannot update invalid object %s",(this->path)._M_dataplus._M_p);
  }
  else {
    MutexLocker::MutexLocker(&local_28,this->objectMutex);
    this_00 = &this->attributes;
    ppOVar2 = std::
              map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
              ::operator[](this_00,&local_30);
    pOVar1 = *ppOVar2;
    if (pOVar1 == (mapped_type)0x0) {
      softHSMLog(7,"deleteAttribute",
                 "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/object_store/ObjectFile.cpp"
                 ,0xfb,"Cannot delete attribute that doesn\'t exist in object %s",
                 (this->path)._M_dataplus._M_p);
    }
    else {
      ppOVar2 = std::
                map<unsigned_long,_OSAttribute_*,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
                ::operator[](this_00,&local_30);
      if (*ppOVar2 != (mapped_type)0x0) {
        (*(*ppOVar2)->_vptr_OSAttribute[1])();
      }
      pVar4 = std::
              _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute_*>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
              ::equal_range(&this_00->_M_t,&local_30);
      std::
      _Rb_tree<unsigned_long,_std::pair<const_unsigned_long,_OSAttribute_*>,_std::_Select1st<std::pair<const_unsigned_long,_OSAttribute_*>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_OSAttribute_*>_>_>
      ::_M_erase_aux(&this_00->_M_t,(_Base_ptr)pVar4.first._M_node,(_Base_ptr)pVar4.second._M_node);
    }
    MutexLocker::~MutexLocker(&local_28);
    if (pOVar1 == (mapped_type)0x0) {
      uVar3 = 0;
    }
    else {
      store(this,false);
      uVar3 = this->valid;
    }
  }
  return (bool)uVar3;
}

Assistant:

bool ObjectFile::deleteAttribute(CK_ATTRIBUTE_TYPE type)
{
	if (!valid)
	{
		DEBUG_MSG("Cannot update invalid object %s", path.c_str());

		return false;
	}

	{
		MutexLocker lock(objectMutex);

		if (attributes[type] == NULL)
		{
			DEBUG_MSG("Cannot delete attribute that doesn't exist in object %s", path.c_str());

			return false;
		}

		delete attributes[type];
		attributes.erase(type);
	}

	store();

	return valid;
}